

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_gej_var(secp256k1_ge *r,secp256k1_gej *a)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  long in_RDI;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_ge *in_stack_ffffffffffffffa0;
  secp256k1_fe *in_stack_ffffffffffffffe8;
  
  secp256k1_gej_verify((secp256k1_gej *)0x108798);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1087a2);
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 0;
    secp256k1_fe_impl_inv_var(in_RSI,in_stack_ffffffffffffffe8);
    secp256k1_fe_impl_sqr(&in_stack_ffffffffffffffa0->x,in_stack_ffffffffffffff98);
    secp256k1_fe_impl_mul
              (&in_stack_ffffffffffffffa0->x,in_stack_ffffffffffffff98,(secp256k1_fe *)0x108804);
    secp256k1_fe_impl_mul
              (&in_stack_ffffffffffffffa0->x,in_stack_ffffffffffffff98,(secp256k1_fe *)0x108818);
    secp256k1_fe_impl_mul
              (&in_stack_ffffffffffffffa0->x,in_stack_ffffffffffffff98,(secp256k1_fe *)0x108834);
    secp256k1_fe_impl_set_int(in_RSI + 2,1);
    secp256k1_ge_set_xy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x10885f
                       );
    secp256k1_gej_verify((secp256k1_gej *)0x108869);
    secp256k1_ge_verify((secp256k1_ge *)0x108873);
  }
  else {
    secp256k1_ge_set_infinity((secp256k1_ge *)0x1087b1);
  }
  return;
}

Assistant:

static void secp256k1_ge_set_gej_var(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    SECP256K1_GEJ_VERIFY(a);

    if (secp256k1_gej_is_infinity(a)) {
        secp256k1_ge_set_infinity(r);
        return;
    }
    r->infinity = 0;
    secp256k1_fe_inv_var(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    secp256k1_ge_set_xy(r, &a->x, &a->y);

    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(r);
}